

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

void __thiscall kj::anon_unknown_59::InMemoryFile::~InMemoryFile(InMemoryFile *this)

{
  InMemoryFile *this_local;
  
  ~InMemoryFile(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

InMemoryFile(const Clock& clock): impl(clock) {}